

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointAddSourceFilter(HelicsEndpoint end,char *filterName,HelicsError *err)

{
  Endpoint *this;
  size_t sVar1;
  string_view filterName_00;
  
  if (err == (HelicsError *)0x0) {
    if (end == (HelicsEndpoint)0x0) {
      return;
    }
    if (*(int *)((long)end + 0x20) != -0x4bac6b3e) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((end == (HelicsEndpoint)0x0) || (*(int *)((long)end + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      return;
    }
  }
  this = *end;
  sVar1 = strlen(filterName);
  filterName_00._M_str = filterName;
  filterName_00._M_len = sVar1;
  helics::Endpoint::addSourceFilter(this,filterName_00);
  return;
}

Assistant:

void helicsEndpointAddSourceFilter(HelicsEndpoint end, const char* filterName, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->addSourceFilter(filterName);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}